

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void player_learn_curse(player *p,curse *curse)

{
  wchar_t wVar1;
  
  wVar1 = lookup_curse(curse->name);
  wVar1 = rune_index(5,wVar1);
  if (L'\xffffffff' < wVar1) {
    player_learn_rune(p,(ulong)(uint)wVar1,true);
  }
  update_player_object_knowledge(p);
  return;
}

Assistant:

void player_learn_curse(struct player *p, struct curse *curse)
{
	int index = rune_index(RUNE_VAR_CURSE, lookup_curse(curse->name));
	if (index >= 0) {
		player_learn_rune(p, index, true);
	}
	update_player_object_knowledge(p);
}